

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_hull(Impl *this)

{
  MetadataKind MVar1;
  ValueKind VVar2;
  uint uVar3;
  uint value1;
  uint uVar4;
  ExecutionMode EVar5;
  uint uVar6;
  Builder *this_00;
  MDNode *this_01;
  ConstantAsMetadata *this_02;
  Constant *value;
  Function *this_03;
  Function *entryPoint;
  void *pvVar7;
  LoggingCallback p_Var8;
  byte bVar9;
  char buffer [4096];
  Capability local_1038 [5];
  undefined3 uStack_1023;
  undefined5 uStack_1020;
  undefined2 uStack_101b;
  uint uStack_1019;
  undefined1 uStack_1015;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  local_1038[0] = 3;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this_00->capabilities,local_1038);
  this_01 = (MDNode *)get_shader_property_tag(this->entry_point_meta,HSState);
  if (this_01 == (MDNode *)0x0) {
    return false;
  }
  MVar1 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)this_01);
  if (MVar1 != Node) {
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      emit_execution_modes_hull();
      std::terminate();
    }
LAB_00123fcb:
    stack0xffffffffffffefd8 = 0x6163206e69;
    uStack_1023 = 0x3c7473;
    uStack_1020 = 0xa2e3e54;
    local_1038._0_8_ = 0x2064696c61766e49;
    local_1038[2] = 0x65707974;
    local_1038[3] = 0x20444920;
    pvVar7 = get_thread_log_callback_userdata();
    (*p_Var8)(pvVar7,Error,(char *)local_1038);
    std::terminate();
  }
  this_02 = (ConstantAsMetadata *)LLVMBC::MDNode::getOperand(this_01,0);
  MVar1 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)this_02);
  if (MVar1 != Constant) {
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      emit_execution_modes_hull();
      std::terminate();
    }
    goto LAB_00123fcb;
  }
  value = LLVMBC::ConstantAsMetadata::getValue(this_02);
  this_03 = (Function *)LLVMBC::Internal::resolve_proxy(&value->super_Value);
  VVar2 = LLVMBC::Value::get_value_kind((Value *)this_03);
  if (VVar2 != Function) {
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      emit_execution_modes_hull();
      std::terminate();
    }
    goto LAB_00123fcb;
  }
  (this->execution_mode_meta).patch_constant_function = this_03;
  uVar3 = get_constant_metadata<unsigned_int>(this_01,1);
  value1 = get_constant_metadata<unsigned_int>(this_01,2);
  uVar4 = get_constant_metadata<unsigned_int>(this_01,3);
  EVar5 = get_constant_metadata<unsigned_int>(this_01,4);
  uVar6 = get_constant_metadata<unsigned_int>(this_01,5);
  entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
  bVar9 = (char)uVar4 - 1;
  if (2 < bVar9) {
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      emit_execution_modes_hull();
      return false;
    }
    stack0xffffffffffffefd8 = 0x6420726f74;
    uStack_1023 = 0x616d6f;
    uStack_1020 = 0xa216e69;
LAB_00123e2e:
    local_1038[3] = 0x616c6c65;
    local_1038[2] = 0x73736574;
    local_1038._0_8_ = 0x206e776f6e6b6e55;
    pvVar7 = get_thread_log_callback_userdata();
    (*p_Var8)(pvVar7,Error,(char *)local_1038);
    return false;
  }
  spv::Builder::addExecutionMode
            (this_00,entryPoint,*(ExecutionMode *)(&DAT_001c2650 + (ulong)bVar9 * 4),-1,-1,-1);
  EVar5 = EVar5 & 0xff;
  switch(EVar5) {
  case ExecutionModeSpacingEqual:
    break;
  case ExecutionModeSpacingFractionalEven:
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      emit_execution_modes_hull();
    }
    else {
      stack0xffffffffffffefd8 = 0x6e69636170;
      uStack_1023 = 0x612067;
      uStack_1020 = 0x746e492073;
      uStack_101b = 0x6765;
      local_1038._0_8_ = 0x6e6974616c756d45;
      local_1038[2] = 0x6f502067;
      local_1038[3] = 0x73203277;
      uStack_1019 = 0xa2e7265;
      uStack_1015 = 0;
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var8)(pvVar7,Error,(char *)local_1038);
    }
    EVar5 = ExecutionModeSpacingEqual;
    break;
  case ExecutionModeSpacingFractionalOdd:
    EVar5 = ExecutionModeSpacingFractionalOdd;
    break;
  case ExecutionModeVertexOrderCw:
    EVar5 = ExecutionModeSpacingFractionalEven;
    break;
  default:
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      emit_execution_modes_hull();
      return false;
    }
    stack0xffffffffffffefd8 = 0x7020726f74;
    uStack_1023 = 0x747261;
    uStack_1020 = 0x6e6f697469;
    uStack_101b = 0x6e69;
    uStack_1019 = 0xa2e67;
    goto LAB_00123e2e;
  }
  spv::Builder::addExecutionMode(this_00,entryPoint,EVar5,-1,-1,-1);
  switch(uVar6 & 0xff) {
  case 1:
    EVar5 = ExecutionModePointMode;
    break;
  case 2:
    goto switchD_00123e99_caseD_2;
  case 3:
    EVar5 = ExecutionModeVertexOrderCw;
    break;
  case 4:
    EVar5 = ExecutionModeVertexOrderCcw;
    break;
  default:
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      emit_execution_modes_hull();
      return false;
    }
    stack0xffffffffffffefd8 = 0x7020726f74;
    uStack_1023 = 0x6d6972;
    uStack_1020 = 0x6576697469;
    uStack_101b = 0xa2e;
    uStack_1019 = uStack_1019 & 0xffffff00;
    goto LAB_00123e2e;
  }
  spv::Builder::addExecutionMode(this_00,entryPoint,EVar5,-1,-1,-1);
switchD_00123e99_caseD_2:
  spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputVertices,value1,-1,-1);
  (this->execution_mode_meta).stage_input_num_vertex = uVar3;
  (this->execution_mode_meta).stage_output_num_vertex = value1;
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_hull()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityTessellation);
	auto *hs_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::HSState);

	if (hs_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*hs_state_node);

		auto *patch_constant = llvm::cast<llvm::ConstantAsMetadata>(arguments->getOperand(0));
		auto *patch_constant_value = patch_constant->getValue();
		execution_mode_meta.patch_constant_function = llvm::cast<llvm::Function>(patch_constant_value);

		unsigned input_control_points = get_constant_metadata(arguments, 1);
		unsigned output_control_points = get_constant_metadata(arguments, 2);
		auto domain = static_cast<DXIL::TessellatorDomain>(get_constant_metadata(arguments, 3));
		auto partitioning = static_cast<DXIL::TessellatorPartitioning>(get_constant_metadata(arguments, 4));
		auto primitive = static_cast<DXIL::TessellatorOutputPrimitive>(get_constant_metadata(arguments, 5));

		auto *func = spirv_module.get_entry_function();

		switch (domain)
		{
		case DXIL::TessellatorDomain::IsoLine:
			builder.addExecutionMode(func, spv::ExecutionModeIsolines);
			break;

		case DXIL::TessellatorDomain::Tri:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			break;

		case DXIL::TessellatorDomain::Quad:
			builder.addExecutionMode(func, spv::ExecutionModeQuads);
			break;

		default:
			LOGE("Unknown tessellator domain!\n");
			return false;
		}

		switch (partitioning)
		{
		case DXIL::TessellatorPartitioning::Integer:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingEqual);
			break;

		case DXIL::TessellatorPartitioning::Pow2:
			LOGE("Emulating Pow2 spacing as Integer.\n");
			builder.addExecutionMode(func, spv::ExecutionModeSpacingEqual);
			break;

		case DXIL::TessellatorPartitioning::FractionalEven:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingFractionalEven);
			break;

		case DXIL::TessellatorPartitioning::FractionalOdd:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingFractionalOdd);
			break;

		default:
			LOGE("Unknown tessellator partitioning.\n");
			return false;
		}

		switch (primitive)
		{
		case DXIL::TessellatorOutputPrimitive::TriangleCCW:
			builder.addExecutionMode(func, spv::ExecutionModeVertexOrderCcw);
			break;

		case DXIL::TessellatorOutputPrimitive::TriangleCW:
			builder.addExecutionMode(func, spv::ExecutionModeVertexOrderCw);
			break;

		case DXIL::TessellatorOutputPrimitive::Point:
			builder.addExecutionMode(func, spv::ExecutionModePointMode);
			// TODO: Do we have to specify CCW/CW in point mode?
			break;

		case DXIL::TessellatorOutputPrimitive::Line:
			break;

		default:
			LOGE("Unknown tessellator primitive.\n");
			return false;
		}

		builder.addExecutionMode(func, spv::ExecutionModeOutputVertices, output_control_points);

		execution_mode_meta.stage_input_num_vertex = input_control_points;
		execution_mode_meta.stage_output_num_vertex = output_control_points;
		return true;
	}
	else
		return false;
}